

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

float similarity(string *s0,string *s1)

{
  ulong uVar1;
  pointer pcVar2;
  pointer pcVar3;
  undefined1 auVar4 [16];
  pointer piVar5;
  pointer piVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  size_type sVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  vector<int,_std::allocator<int>_> prevCol;
  vector<int,_std::allocator<int>_> col;
  allocator_type local_7d;
  value_type_conflict2 local_7c;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  string *local_48;
  string *local_40;
  size_type local_38;
  long lVar17;
  
  local_38 = s0->_M_string_length;
  uVar9 = s1->_M_string_length;
  uVar1 = uVar9 + 1;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffff00000000);
  local_48 = s0;
  local_40 = s1;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_60,uVar1,(value_type_conflict2 *)&local_78,(allocator_type *)&local_7c);
  local_7c = 0;
  std::vector<int,_std::allocator<int>_>::vector(&local_78,uVar1,&local_7c,&local_7d);
  auVar4 = _DAT_001210b0;
  if (uVar1 != 0) {
    auVar15._8_4_ = (int)uVar9;
    auVar15._0_8_ = uVar9;
    auVar15._12_4_ = (int)(uVar9 >> 0x20);
    lVar7 = 0;
    auVar15 = auVar15 ^ _DAT_001210b0;
    auVar16 = _DAT_001210a0;
    do {
      auVar18 = auVar16 ^ auVar4;
      if ((bool)(~(auVar18._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar18._0_4_ ||
                  auVar15._4_4_ < auVar18._4_4_) & 1)) {
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar7] = (int)lVar7;
      }
      if ((auVar18._12_4_ != auVar15._12_4_ || auVar18._8_4_ <= auVar15._8_4_) &&
          auVar18._12_4_ <= auVar15._12_4_) {
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar7 + 1] = (int)lVar7 + 1;
      }
      lVar7 = lVar7 + 2;
      lVar17 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 2;
      auVar16._8_8_ = lVar17 + 2;
    } while ((uVar9 & 0xfffffffffffffffe) + 2 != lVar7);
  }
  if (local_38 != 0xffffffffffffffff) {
    piVar5 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar6 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    sVar11 = 0;
    do {
      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = piVar6;
      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = piVar5;
      *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start = (int)sVar11;
      if (1 < uVar1) {
        pcVar2 = (local_48->_M_dataplus)._M_p;
        pcVar3 = (local_40->_M_dataplus)._M_p;
        iVar8 = *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar12 = 0;
        do {
          if (sVar11 == 0) {
            uVar13 = 1;
          }
          else {
            uVar13 = (uint)(pcVar2[sVar11 - 1] != pcVar3[uVar12]);
          }
          iVar10 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12 + 1] + 1;
          if (iVar8 + 1 <=
              local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar12 + 1] + 1) {
            iVar10 = iVar8 + 1;
          }
          iVar8 = iVar10;
          if ((int)(uVar13 + local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar12]) < iVar10) {
            iVar8 = uVar13 + local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar12];
          }
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar12 + 1] = iVar8;
          uVar12 = uVar12 + 1;
        } while (uVar9 != uVar12);
      }
      bVar14 = sVar11 != local_38;
      piVar5 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      sVar11 = sVar11 + 1;
    } while (bVar14);
  }
  iVar8 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar9];
  uVar1 = local_48->_M_string_length;
  uVar9 = local_40->_M_string_length;
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (uVar9 < uVar1) {
    uVar9 = uVar1;
  }
  return 1.0 - (float)iVar8 / (float)uVar9;
}

Assistant:

float similarity(const std::string & s0, const std::string & s1) {
    const size_t len0 = s0.size() + 1;
    const size_t len1 = s1.size() + 1;

    std::vector<int> col(len1, 0);
    std::vector<int> prevCol(len1, 0);

    for (size_t i = 0; i < len1; i++) {
        prevCol[i] = i;
    }

    for (size_t i = 0; i < len0; i++) {
        col[0] = i;
        for (size_t j = 1; j < len1; j++) {
            col[j] = std::min(std::min(1 + col[j - 1], 1 + prevCol[j]), prevCol[j - 1] + (i > 0 && s0[i - 1] == s1[j - 1] ? 0 : 1));
        }
        col.swap(prevCol);
    }

    const float dist = prevCol[len1 - 1];

    return 1.0f - (dist / std::max(s0.size(), s1.size()));
}